

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-read-bits.h
# Opt level: O1

int read_bits(coda_product *product,int64_t bit_offset,int64_t bit_length,uint8_t *dst)

{
  coda_product *product_00;
  int iVar1;
  sbyte sVar2;
  ulong uVar3;
  undefined1 *puVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint8_t *puVar8;
  long length;
  uint uVar9;
  anon_union_4_2_99f8264b data;
  uint8_t buffer_1;
  uint8_t buffer [4];
  uint8_t uStack_4d;
  undefined4 local_4c;
  byte local_45;
  ushort local_44;
  ushort local_42;
  coda_product *local_40;
  ulong local_38;
  
  uVar3 = (ulong)((uint)bit_offset & 7);
  lVar7 = uVar3 + bit_length;
  uVar9 = -(int)lVar7 & 7;
  sVar2 = (sbyte)uVar9;
  lVar6 = bit_offset >> 3;
  if (lVar7 < 9) {
    iVar1 = read_bytes(product,lVar6,1,dst);
    if (iVar1 != 0) {
      return -1;
    }
    if (uVar9 != 0) {
      *dst = *dst >> sVar2;
    }
    if ((bit_length & 7U) != 0) {
      *dst = *dst & ~(byte)(-1 << ((byte)bit_length & 0x1f));
    }
  }
  else if (uVar9 == 0) {
    uVar3 = bit_length & 7;
    if (uVar3 != 0) {
      iVar1 = read_bytes(product,lVar6,1,&local_45);
      if (iVar1 != 0) {
        return -1;
      }
      *dst = ~(-1 << (sbyte)uVar3) & local_45;
      dst = dst + 1;
      bit_offset = bit_offset + uVar3;
      bit_length = bit_length & 0xfffffffffffffff8;
    }
    if ((0 < bit_length) &&
       (iVar1 = read_bytes(product,bit_offset >> 3,(ulong)bit_length >> 3,dst), iVar1 != 0)) {
      return -1;
    }
  }
  else {
    uVar5 = bit_length +
            (((ulong)(bit_length / 6 + (bit_length >> 0x3f)) >> 2) - (bit_length >> 0x3f)) * -0x18;
    local_40 = product;
    if (uVar5 != 0) {
      uVar3 = uVar3 + uVar5;
      length = ((uVar3 >> 3) + 1) - (ulong)((uVar3 & 7) == 0);
      lVar7 = ((uVar5 >> 3) + 1) - (ulong)((uVar5 & 7) == 0);
      local_38 = uVar5;
      iVar1 = read_bytes(product,lVar6,length,&local_44);
      if (iVar1 == 0) {
        local_4c = 0;
        if (length != 0) {
          puVar4 = (undefined1 *)((long)&local_4c + 3);
          lVar6 = 0;
          do {
            *puVar4 = *(undefined1 *)((long)&local_44 + lVar6);
            lVar6 = lVar6 + 1;
            puVar4 = puVar4 + -1;
          } while (length != lVar6);
        }
        local_4c = ~(-1 << ((byte)local_38 & 0x1f)) & 0U >> (sVar2 + (char)length * -8 & 0x1fU);
        puVar8 = dst;
        for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar8 = (&uStack_4d)[lVar6];
          puVar8 = puVar8 + 1;
        }
        dst = dst + lVar7;
        bit_offset = bit_offset + local_38;
        bit_length = bit_length - local_38;
      }
      if (iVar1 != 0) {
        return -1;
      }
    }
    product_00 = local_40;
    if (0 < bit_length) {
      lVar7 = bit_length + 0x18;
      do {
        iVar1 = read_bytes(product_00,bit_offset >> 3,4,&local_44);
        if (iVar1 != 0) {
          return -1;
        }
        local_4c = CONCAT22(local_44 << 8 | local_44 >> 8,local_42 << 8 | local_42 >> 8);
        uVar9 = local_4c >> sVar2;
        local_4c._2_1_ = (uint8_t)(uVar9 >> 0x10);
        *dst = local_4c._2_1_;
        local_4c._1_1_ = (uint8_t)(uVar9 >> 8);
        dst[1] = local_4c._1_1_;
        local_4c._0_1_ = (uint8_t)uVar9;
        dst[2] = (uint8_t)local_4c;
        dst = dst + 3;
        bit_offset = bit_offset + 0x18;
        lVar7 = lVar7 + -0x18;
        local_4c = uVar9;
      } while (0x18 < lVar7);
    }
  }
  return 0;
}

Assistant:

static int read_bits(coda_product *product, int64_t bit_offset, int64_t bit_length, uint8_t *dst)
{
    unsigned long bit_shift;
    int64_t padded_bit_length;

    /* we read bits by treating them as big endian numbers.
     * This means that
     *
     *      src[0]     |    src[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  . . a b c d e f|g h i j k . . .
     *
     * will be read and shifted to get
     *
     *      dst[0]     |    dst[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  . . . . . a b c|d e f g h i j k
     * 
     * If the value is a number then on little endian machines the value needs to be converted to:
     *
     *      dst[0]     |    dst[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  d e f g h i j k|0 0 0 0 0 a b c
     *
     * Note that endian conversion does not happen within this function but happens in the functions that call
     * read_bits().
     *
     * In theory we could also implement support for bitdata stored in lsb (least significant bit) to msb order.
     * However, such a feature is currently NOT implemented!
     * If we ever implement such a feature it should look like this:
     * If the format of the source is (note the reverse order in which we display the bits!):
     *
     *      src[0]     |    src[1]
     *  0 1 2 3 4 5 6 7|0 1 2 3 4 5 6 7
     *  . . a b c d e f|g h i j k . . .
     *
     * then this will be read as
     *
     *      tmp[0]     |    tmp[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  f e d c b a . .|. . . k j i h g
     *
     * we can then perform a shift of bits (shifting 2 least significant bits from the right byte to the left byte)
     * to get the little endian result
     *
     *      dst[0]     |    dst[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  h g f e d c b a|. . . . . k j i
     *
     * On big endian machines this can then be turned into a big endian number
     *
     *      dst[0]     |    dst[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  0 0 0 0 0 k j i|h g f e d c b a
     */

    /* The padded bit length is the number of 'padding' bits plus the bit length.
     * The 'padding' bits are the bits between the start of byte (i.e. starting at the most significant bit) and the
     * start of requested bits (in the (big endian) example above, bits 7 and 6 of src[0] are the padding bits).
     */
    padded_bit_length = (bit_offset & 0x7) + bit_length;
    bit_shift = (unsigned long)(-padded_bit_length & 0x7);
    if (padded_bit_length <= 8)
    {
        /* all bits are located within a single byte, so we will use an optimized approach to extract the bits */
        if (read_bytes(product, bit_offset >> 3, 1, dst) != 0)
        {
            return -1;
        }
        if (bit_shift != 0)
        {
            *dst >>= bit_shift;
        }
        if ((bit_length & 0x7) != 0)
        {
            *dst &= ((1 << bit_length) - 1);
        }
    }
    else if (bit_shift == 0)
    {
        /* no shifting needed for the source bytes */
        if (bit_length & 0x7)
        {
            unsigned long trailing_bit_length;
            uint8_t buffer;

            /* the first byte contains trailing bits and is not copied in full */
            if (read_bytes(product, bit_offset >> 3, 1, &buffer) != 0)
            {
                return -1;
            }
            trailing_bit_length = (unsigned long)(bit_length & 0x7);
            *dst = buffer & ((1 << trailing_bit_length) - 1);
            dst++;
            bit_offset += trailing_bit_length;
            bit_length -= trailing_bit_length;
        }
        if (bit_length > 0)
        {
            /* use a plain copy for the remaining bytes */
            if (read_bytes(product, bit_offset >> 3, bit_length >> 3, dst) != 0)
            {
                return -1;
            }
        }
    }
    else
    {
        uint8_t buffer[4];
        union
        {
            uint8_t as_bytes[4];
            uint32_t as_uint32;
        } data;

        /* we need to shift each byte */

        /* we first copy the part modulo 24 bits (so the rest can be processed in chuncks of 24 bits each) */
        if (bit_length % 24 != 0)
        {
            unsigned long mod24_bit_length;
            unsigned long num_bytes_read;
            unsigned long num_bytes_set;
            unsigned long i;

            mod24_bit_length = (unsigned long)(bit_length % 24);
            num_bytes_read = bit_size_to_byte_size(((unsigned long)(bit_offset & 0x7)) + mod24_bit_length);
            num_bytes_set = bit_size_to_byte_size(mod24_bit_length);
            if (read_bytes(product, bit_offset >> 3, num_bytes_read, buffer) != 0)
            {
                return -1;
            }
            data.as_uint32 = 0;
            for (i = 0; i < num_bytes_read; i++)
            {
#ifdef WORDS_BIGENDIAN
                data.as_bytes[i] = buffer[i];
#else
                data.as_bytes[3 - i] = buffer[i];
#endif
            }
            data.as_uint32 = (data.as_uint32 >> (bit_shift + 8 * (4 - num_bytes_read))) & ((1 << mod24_bit_length) - 1);
            for (i = 0; i < num_bytes_set; i++)
            {
#ifdef WORDS_BIGENDIAN
                dst[i] = data.as_bytes[(4 - num_bytes_set) + i];
#else
                dst[i] = data.as_bytes[(num_bytes_set - 1) - i];
#endif
            }
            dst += num_bytes_set;
            bit_offset += mod24_bit_length;
            bit_length -= mod24_bit_length;
        }

        /* we copy the remaining data in chunks of 24 bits (3 bytes) at a time */
        while (bit_length > 0)
        {
#ifdef WORDS_BIGENDIAN
            if (read_bytes(product, bit_offset >> 3, 4, data.as_bytes) != 0)
            {
                return -1;
            }
            data.as_uint32 >>= bit_shift;
            dst[0] = data.as_bytes[1];
            dst[1] = data.as_bytes[2];
            dst[2] = data.as_bytes[3];
#else
            if (read_bytes(product, bit_offset >> 3, 4, buffer) != 0)
            {
                return -1;
            }
            data.as_bytes[0] = buffer[3];
            data.as_bytes[1] = buffer[2];
            data.as_bytes[2] = buffer[1];
            data.as_bytes[3] = buffer[0];
            data.as_uint32 >>= bit_shift;
            dst[0] = data.as_bytes[2];
            dst[1] = data.as_bytes[1];
            dst[2] = data.as_bytes[0];
#endif
            dst += 3;
            bit_offset += 24;
            bit_length -= 24;
        }
    }

    return 0;
}